

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O2

void pnga_proc_topology(Integer g_a,Integer proc,Integer *subscript)

{
  long lVar1;
  ushort uVar2;
  int iVar3;
  global_array_t *pgVar4;
  ulong uVar5;
  char err_string [256];
  char acStack_138 [264];
  
  lVar1 = g_a + 1000;
  if ((g_a < -1000) || (_max_global_array <= lVar1)) {
    sprintf(acStack_138,"%s: INVALID ARRAY HANDLE","nga_proc_topology");
    pnga_error(acStack_138,g_a);
  }
  if (GA[lVar1].actv == 0) {
    sprintf(acStack_138,"%s: ARRAY NOT ACTIVE","nga_proc_topology");
    pnga_error(acStack_138,g_a);
  }
  pgVar4 = GA;
  uVar2 = GA[lVar1].ndim;
  uVar5 = 0;
  if ((short)uVar2 < 1) {
    uVar2 = 0;
  }
  for (; uVar2 != uVar5; uVar5 = uVar5 + 1) {
    iVar3 = pgVar4[g_a + 1000].nblock[uVar5];
    subscript[uVar5] = proc % (long)iVar3;
    proc = proc / (long)iVar3;
  }
  return;
}

Assistant:

void pnga_proc_topology(Integer g_a, Integer proc, Integer* subscript)
{
Integer d, index, ndim, ga_handle = GA_OFFSET + g_a;

   ga_check_handleM(g_a, "nga_proc_topology");
   ndim = GA[ga_handle].ndim;

   index = proc;

   for(d=0; d<ndim; d++){
       subscript[d] = index% GA[ga_handle].nblock[d];
       index  /= GA[ga_handle].nblock[d];  
   }
}